

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_floating<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __x;
  bool bVar1;
  char_type_conflict cVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  src_00;
  reference pvVar3;
  value_type *pvVar4;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  double dVar5;
  string sfx;
  source_location src_1;
  region sfx_reg;
  result<double,_toml::error_info> res;
  source_location src;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exponent;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  decpoint;
  bool has_sign;
  floating_type val;
  floating_format_info fmt;
  region reg;
  string str;
  bool is_hex;
  spec *spec;
  location first;
  undefined7 in_stack_fffffffffffff018;
  char_type in_stack_fffffffffffff01f;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff020;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff028;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff030;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  __const_iterator in_stack_fffffffffffff038;
  source_location *in_stack_fffffffffffff040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff048;
  __const_iterator in_stack_fffffffffffff050;
  __const_iterator in_stack_fffffffffffff058;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffff068;
  undefined1 in_stack_fffffffffffff06f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff070;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff078;
  undefined7 in_stack_fffffffffffff088;
  byte in_stack_fffffffffffff08f;
  source_location *in_stack_fffffffffffff090;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff098;
  source_location *in_stack_fffffffffffff0a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff0a8;
  undefined6 in_stack_fffffffffffff0b0;
  undefined1 in_stack_fffffffffffff0b6;
  undefined1 in_stack_fffffffffffff0b7;
  undefined1 is_hex_00;
  source_location *in_stack_fffffffffffff0d8;
  byte local_f11;
  basic_value<toml::type_config> *in_stack_fffffffffffff108;
  location *in_stack_fffffffffffff110;
  sequence *in_stack_fffffffffffff118;
  bool local_eb1;
  pointer local_e38;
  pointer pbStack_e30;
  string *in_stack_fffffffffffff1d8;
  source_location *in_stack_fffffffffffff1e0;
  string *in_stack_fffffffffffff1e8;
  spec *in_stack_fffffffffffff1f8;
  string *in_stack_fffffffffffff270;
  location *in_stack_fffffffffffff278;
  either *in_stack_fffffffffffff280;
  string *in_stack_fffffffffffff288;
  spec *in_stack_fffffffffffff308;
  allocator<char> local_c19 [160];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b79 [24];
  result<double,_toml::error_info> local_870 [3];
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 local_6c9;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  byte local_6a9;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 local_681;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_660;
  undefined1 local_651;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 local_629;
  char *local_628;
  char *local_620;
  char *local_618;
  char local_610;
  long local_608;
  allocator<char> local_5b9 [144];
  allocator<char> local_529 [377];
  uint local_3b0;
  allocator<char> local_3a9 [144];
  allocator<char> local_319 [350];
  byte local_1bb;
  byte local_1ba;
  byte local_1b9;
  byte local_1a1;
  source_location local_90;
  context<toml::type_config> *local_18;
  
  local_18 = in_RDX;
  location::location((location *)in_stack_fffffffffffff040,
                     (location *)in_stack_fffffffffffff038._M_current);
  local_90.last_column_ = (size_t)context<toml::type_config>::toml_spec(local_18);
  local_90.last_line_._7_1_ = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff030._M_current);
  region::region((region *)in_stack_fffffffffffff050._M_current);
  local_1a1 = 0;
  local_1b9 = 0;
  local_1ba = 0;
  local_1bb = 0;
  local_eb1 = false;
  if ((*(bool *)(local_90.last_column_ + 0x13) & 1U) != 0) {
    character::character((character *)in_stack_fffffffffffff020,in_stack_fffffffffffff01f);
    local_1a1 = 1;
    character::character((character *)in_stack_fffffffffffff020,in_stack_fffffffffffff01f);
    local_1b9 = 1;
    sequence::sequence<toml::detail::character,toml::detail::character>
              ((sequence *)in_stack_fffffffffffff040,
               (character *)in_stack_fffffffffffff038._M_current,
               (character *)in_stack_fffffffffffff030._M_current);
    local_1ba = 1;
    sequence::scan(in_stack_fffffffffffff118,in_stack_fffffffffffff110);
    local_1bb = 1;
    local_eb1 = region::is_ok((region *)0x68943c);
  }
  if ((local_1bb & 1) != 0) {
    region::~region((region *)in_stack_fffffffffffff020);
  }
  if ((local_1ba & 1) != 0) {
    sequence::~sequence((sequence *)in_stack_fffffffffffff020);
  }
  if ((local_1b9 & 1) != 0) {
    character::~character((character *)0x68949c);
  }
  if ((local_1a1 & 1) != 0) {
    character::~character((character *)0x6894b5);
  }
  if (local_eb1 == false) {
    syntax::floating(in_stack_fffffffffffff1f8);
    either::scan((either *)in_stack_fffffffffffff058._M_current,
                 (location *)in_stack_fffffffffffff050._M_current);
    region::operator=((region *)in_stack_fffffffffffff020,
                      (region *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    region::~region((region *)in_stack_fffffffffffff020);
    either::~either((either *)in_stack_fffffffffffff020);
    bVar1 = region::is_ok((region *)0x689949);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058._M_current,
                 (allocator<char> *)in_stack_fffffffffffff050._M_current);
      syntax::floating(in_stack_fffffffffffff1f8);
      location::location((location *)in_stack_fffffffffffff040,
                         (location *)in_stack_fffffffffffff038._M_current);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058._M_current,
                 (allocator<char> *)in_stack_fffffffffffff050._M_current);
      make_syntax_error<toml::detail::either>
                (in_stack_fffffffffffff288,in_stack_fffffffffffff280,in_stack_fffffffffffff278,
                 in_stack_fffffffffffff270);
      err<toml::error_info>((error_info *)in_stack_fffffffffffff078._M_current);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff020,
                 (failure_type *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x689a55);
      error_info::~error_info((error_info *)in_stack_fffffffffffff020);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff020);
      std::allocator<char>::~allocator(local_5b9);
      location::~location((location *)in_stack_fffffffffffff020);
      either::~either((either *)in_stack_fffffffffffff020);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff020);
      std::allocator<char>::~allocator(local_529);
      local_3b0 = 1;
      goto LAB_0068aadc;
    }
    region::as_string_abi_cxx11_((region *)in_stack_fffffffffffff078._M_current);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff070,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff06f,in_stack_fffffffffffff068));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff020);
  }
  else {
    location::operator=((location *)in_stack_fffffffffffff020,
                        (location *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    local_90.last_line_._7_1_ = 1;
    syntax::hex_floating(in_stack_fffffffffffff308);
    sequence::scan(in_stack_fffffffffffff118,in_stack_fffffffffffff110);
    region::operator=((region *)in_stack_fffffffffffff020,
                      (region *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    region::~region((region *)in_stack_fffffffffffff020);
    sequence::~sequence((sequence *)in_stack_fffffffffffff020);
    bVar1 = region::is_ok((region *)0x689556);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058._M_current,
                 (allocator<char> *)in_stack_fffffffffffff050._M_current);
      syntax::floating(in_stack_fffffffffffff1f8);
      location::location((location *)in_stack_fffffffffffff040,
                         (location *)in_stack_fffffffffffff038._M_current);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff060,in_stack_fffffffffffff058._M_current,
                 (allocator<char> *)in_stack_fffffffffffff050._M_current);
      make_syntax_error<toml::detail::either>
                (in_stack_fffffffffffff288,in_stack_fffffffffffff280,in_stack_fffffffffffff278,
                 in_stack_fffffffffffff270);
      err<toml::error_info>((error_info *)in_stack_fffffffffffff078._M_current);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff020,
                 (failure_type *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x689662);
      error_info::~error_info((error_info *)in_stack_fffffffffffff020);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff020);
      std::allocator<char>::~allocator(local_3a9);
      location::~location((location *)in_stack_fffffffffffff020);
      either::~either((either *)in_stack_fffffffffffff020);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff020);
      std::allocator<char>::~allocator(local_319);
      local_3b0 = 1;
      goto LAB_0068aadc;
    }
    region::as_string_abi_cxx11_((region *)in_stack_fffffffffffff078._M_current);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff070,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff06f,in_stack_fffffffffffff068));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff020);
  }
  floating_format_info::floating_format_info((floating_format_info *)in_stack_fffffffffffff040);
  if ((local_90.last_line_._7_1_ & 1) == 0) {
    local_620 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018))
    ;
    local_628 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff028._M_current);
    local_629 = 0x65;
    local_618 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                  (in_stack_fffffffffffff038._M_current,in_stack_fffffffffffff030,
                                   in_stack_fffffffffffff028._M_current);
    local_638 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff028._M_current);
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff020,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    local_f11 = 1;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      in_stack_fffffffffffff0d8 = &local_90;
      local_648 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018
                                                ));
      local_650 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                    (in_stack_fffffffffffff028._M_current);
      local_651 = 0x45;
      local_640 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                    (in_stack_fffffffffffff038._M_current,in_stack_fffffffffffff030,
                                     in_stack_fffffffffffff028._M_current);
      local_660 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                    (in_stack_fffffffffffff028._M_current);
      bVar1 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff020,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
      local_f11 = bVar1 ^ 0xff;
    }
    if ((local_f11 & 1) == 0) {
      local_610 = '\x01';
    }
    else {
      local_610 = '\x02';
    }
  }
  else {
    local_610 = '\x03';
  }
  is_hex_00 = (undefined1)((ulong)&local_90 >> 0x38);
  local_678 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
  local_680 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                (in_stack_fffffffffffff028._M_current);
  local_681 = 0x5f;
  src_00 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                     (in_stack_fffffffffffff038._M_current,in_stack_fffffffffffff030,
                      in_stack_fffffffffffff028._M_current);
  local_670 = src_00._M_current;
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff020,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
  local_698 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                (in_stack_fffffffffffff028._M_current);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff020,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
  local_6a0 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                                (in_stack_fffffffffffff048,in_stack_fffffffffffff058,
                                 in_stack_fffffffffffff050);
  local_6a8 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)0x0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff020,
                          (char *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff020,
                              (char *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018))
     , bVar1)) {
    local_6a8 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                std::numeric_limits<double>::infinity();
LAB_0068a4df:
    if (((*(bool *)(local_90.last_column_ + 0x14) & 1U) != 0) &&
       (cVar2 = location::current((location *)
                                  CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018)),
       cVar2 == '_')) {
      syntax::num_suffix((spec *)in_stack_fffffffffffff118);
      sequence::scan(in_stack_fffffffffffff118,in_stack_fffffffffffff110);
      sequence::~sequence((sequence *)in_stack_fffffffffffff020);
      bVar1 = region::is_ok((region *)0x68a564);
      if (bVar1) {
        region::as_string_abi_cxx11_((region *)in_stack_fffffffffffff078._M_current);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff020,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff030._M_current,in_stack_fffffffffffff038);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff020,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff020);
        local_3b0 = 0;
      }
      else {
        region::region((region *)in_stack_fffffffffffff090,
                       (location *)CONCAT17(in_stack_fffffffffffff08f,in_stack_fffffffffffff088));
        source_location::source_location
                  (in_stack_fffffffffffff0a0,(region *)in_stack_fffffffffffff098._M_current);
        region::~region((region *)in_stack_fffffffffffff020);
        location::operator=((location *)in_stack_fffffffffffff020,
                            (location *)
                            CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
        this_00 = local_b79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,in_stack_fffffffffffff058._M_current,
                   (allocator<char> *)in_stack_fffffffffffff050._M_current);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff020,
                   (source_location *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018))
        ;
        __s = local_c19;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)__s,(allocator<char> *)in_stack_fffffffffffff050._M_current);
        make_error_info<>(in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,
                          in_stack_fffffffffffff1d8);
        err<toml::error_info>((error_info *)in_stack_fffffffffffff078._M_current);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffff020,
                   (failure_type *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68a68f);
        error_info::~error_info((error_info *)in_stack_fffffffffffff020);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff020);
        std::allocator<char>::~allocator(local_c19);
        source_location::~source_location((source_location *)in_stack_fffffffffffff020);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff020);
        std::allocator<char>::~allocator((allocator<char> *)local_b79);
        local_3b0 = 1;
        source_location::~source_location((source_location *)in_stack_fffffffffffff020);
      }
      region::~region((region *)in_stack_fffffffffffff020);
      if (local_3b0 != 0) goto LAB_0068aabe;
    }
    in_stack_fffffffffffff020 = local_6a8;
    floating_format_info::floating_format_info
              ((floating_format_info *)local_6a8,
               (floating_format_info *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018)
              );
    local_e38 = (pointer)0x0;
    pbStack_e30 = (pointer)0x0;
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_e38;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x68a97e);
    region::region((region *)in_stack_fffffffffffff020,
                   (region *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)
               CONCAT17(in_stack_fffffffffffff0b7,
                        CONCAT16(in_stack_fffffffffffff0b6,in_stack_fffffffffffff0b0)),
               (floating_type)in_stack_fffffffffffff0a8._M_current,
               (floating_format_info *)in_stack_fffffffffffff0a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff098._M_current,(region_type *)in_stack_fffffffffffff090);
    ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffff108);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff020,
               (success_type *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x68a9f7);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffff020);
    region::~region((region *)in_stack_fffffffffffff020);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    floating_format_info::~floating_format_info((floating_format_info *)0x68aa2b);
    local_3b0 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff020,
                            (char *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    if (bVar1) {
      dVar5 = std::numeric_limits<double>::infinity();
      local_6a8 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                  ((ulong)dVar5 ^ 0x8000000000000000);
      goto LAB_0068a4df;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff020,
                            (char *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff020,
                                (char *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018
                                                )), bVar1)) {
      local_6a8 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                  std::numeric_limits<double>::quiet_NaN();
      goto LAB_0068a4df;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff020,
                            (char *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    if (bVar1) {
      dVar5 = std::numeric_limits<double>::quiet_NaN();
      local_6a8 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
                  ((ulong)dVar5 | 0x8000000000000000);
      goto LAB_0068a4df;
    }
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x689fdb);
    in_stack_fffffffffffff0b7 = false;
    if (!bVar1) {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff020);
      in_stack_fffffffffffff0b6 = true;
      in_stack_fffffffffffff0b7 = in_stack_fffffffffffff0b6;
      if (*pvVar3 != '+') {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff020);
        in_stack_fffffffffffff0b6 = *pvVar3 == '-';
        in_stack_fffffffffffff0b7 = in_stack_fffffffffffff0b6;
      }
    }
    in_stack_fffffffffffff0a0 = &local_90;
    local_6a9 = in_stack_fffffffffffff0b7;
    local_6c0 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018))
    ;
    local_6c8 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff028._M_current);
    local_6c9 = 0x2e;
    in_stack_fffffffffffff0a8 =
         std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                   (in_stack_fffffffffffff038._M_current,in_stack_fffffffffffff030,
                    in_stack_fffffffffffff028._M_current);
    in_stack_fffffffffffff090 = &local_90;
    local_6b8 = in_stack_fffffffffffff0a8._M_current;
    local_6e0 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018))
    ;
    local_6e8 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff028._M_current);
    in_stack_fffffffffffff098 =
         std::
         find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,toml::detail::parse_floating<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_1_>
                   (local_6e0,local_6e8);
    local_6d8 = in_stack_fffffffffffff098._M_current;
    local_6f8 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff028._M_current);
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff020,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
    in_stack_fffffffffffff08f = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_700 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                    (in_stack_fffffffffffff028._M_current);
      bVar1 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff020,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
      in_stack_fffffffffffff08f = bVar1 ^ 0xff;
    }
    if (local_610 == '\x02') {
      local_708 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018
                                                ));
      local_710 = local_6d8;
      local_608 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (in_stack_fffffffffffff030,in_stack_fffffffffffff028);
      if ((local_6a9 & 1) != 0) {
        local_608 = local_608 + -1;
      }
      local_718 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                    (in_stack_fffffffffffff028._M_current);
      bVar1 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff020,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_608 = local_608 + -1;
      }
    }
    else if (local_610 == '\x03') {
      local_608 = 0x11;
    }
    else {
      local_728 = local_6b8;
      __x._M_current._7_1_ = in_stack_fffffffffffff01f;
      __x._M_current._0_7_ = in_stack_fffffffffffff018;
      in_stack_fffffffffffff078 =
           std::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__x,0x68a287);
      local_730 = local_6d8;
      local_720 = in_stack_fffffffffffff078._M_current;
      local_608 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (in_stack_fffffffffffff030,in_stack_fffffffffffff028);
    }
    region::region((region *)in_stack_fffffffffffff090,
                   (location *)CONCAT17(in_stack_fffffffffffff08f,in_stack_fffffffffffff088));
    source_location::source_location
              (in_stack_fffffffffffff0a0,(region *)in_stack_fffffffffffff098._M_current);
    region::~region((region *)in_stack_fffffffffffff020);
    source_location::source_location
              (in_stack_fffffffffffff040,(source_location *)in_stack_fffffffffffff038._M_current);
    type_config::parse_float
              ((string *)in_stack_fffffffffffff0d8,(source_location *)src_00._M_current,
               (bool)is_hex_00);
    source_location::~source_location((source_location *)in_stack_fffffffffffff020);
    bVar1 = result<double,_toml::error_info>::is_ok(local_870);
    if (bVar1) {
      pvVar4 = result<double,_toml::error_info>::as_ok((result<double,_toml::error_info> *)0x68a382)
      ;
      local_6a8 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)*pvVar4;
    }
    else {
      result<double,_toml::error_info>::as_err((result<double,_toml::error_info> *)0x68a406);
      err<toml::error_info_const&>((error_info *)in_stack_fffffffffffff078._M_current);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff020,
                 (failure_type *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018));
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68a43c);
    }
    local_3b0 = (uint)!bVar1;
    result<double,_toml::error_info>::~result((result<double,_toml::error_info> *)0x68a49a);
    source_location::~source_location((source_location *)in_stack_fffffffffffff020);
    if (local_3b0 == 0) goto LAB_0068a4df;
  }
LAB_0068aabe:
  floating_format_info::~floating_format_info((floating_format_info *)0x68aacb);
LAB_0068aadc:
  region::~region((region *)in_stack_fffffffffffff020);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff020);
  location::~location((location *)in_stack_fffffffffffff020);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_floating(location& loc, const context<TC>& ctx)
{
    using floating_type = typename basic_value<TC>::floating_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    bool is_hex = false;
    std::string str;
    region reg;
    if(spec.ext_hex_float && sequence(character('0'), character('x')).scan(loc).is_ok())
    {
        loc = first;
        is_hex = true;

        reg = syntax::hex_floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid hex floating: float must be like: 0xABCp-3f",
                syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }
    else
    {
        reg = syntax::floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid floating: float must be like: -3.14159_26535, 6.022e+23, "
                "inf, or nan (lowercase).", syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    floating_format_info fmt;

    if(is_hex)
    {
        fmt.fmt = floating_format::hex;
    }
    else
    {
        // since we already checked that the string conforms the TOML standard.
        if(std::find(str.begin(), str.end(), 'e') != str.end() ||
           std::find(str.begin(), str.end(), 'E') != str.end())
        {
            fmt.fmt = floating_format::scientific; // use exponent part
        }
        else
        {
            fmt.fmt = floating_format::fixed; // do not use exponent part
        }
    }

    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    floating_type val{0};

    if(str == "inf" || str == "+inf")
    {
        TOML11_CONSTEXPR_IF(std::numeric_limits<floating_type>::has_infinity)
        {
            val = std::numeric_limits<floating_type>::infinity();
        }
        else
        {
            return err(make_error_info("toml::parse_floating: inf value found"
                " but the current environment does not support inf. Please"
                " make sure that the floating-point implementation conforms"
                " IEEE 754/ISO 60559 international standard.",
                source_location(region(loc)),
                "floating_type: inf is not supported"));
        }
    }